

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<143u,Fixpp::Type::String>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<143u,Fixpp::Type::String>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *cursor;
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  char *pcVar5;
  Type type;
  
  cursor = context->cursor;
  lVar1 = *(long *)&cursor->buf->field_0x8;
  pcVar5 = *(char **)&cursor->buf->field_0x10;
  bVar4 = match_until_fast('|',cursor);
  if (bVar4) {
    lVar2 = *(long *)&cursor->buf->field_0x8;
    lVar3 = *(long *)&cursor->buf->field_0x10;
    bVar4 = StreamCursor::advance(cursor,1);
    if (bVar4) {
      (field->m_view).first = pcVar5;
      (field->m_view).second = (lVar1 + lVar3) - (long)(pcVar5 + lVar2);
      TagSet<Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
      ::set(&tagSet->
             super_TagSet<Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
            ,0x8f);
      return;
    }
    pcVar5 = "Expected value after tag \'%d\', got EOF";
    type = Incomplete;
  }
  else {
    pcVar5 = "Expected value tag \'%d\', got EOF";
    type = ParsingError;
  }
  ParsingContext::setError(context,type,pcVar5,0x8f);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }